

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O2

deUint32 tcu::distSquaredToNeighbor<4>
                   (Random *rnd,deUint32 pixel,ConstPixelBufferAccess *surface,int x,int y)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  deUint32 dVar6;
  int iVar7;
  int iVar8;
  int d;
  long lVar9;
  float fVar10;
  float fVar11;
  
  pvVar3 = surface->m_data;
  iVar8 = (surface->m_pitch).m_data[1];
  uVar4 = colorDistSquared(pixel,*(deUint32 *)((long)pvVar3 + (long)(x * 4) + (long)(iVar8 * y)));
  if (uVar4 != 0) {
    iVar1 = (surface->m_size).m_data[0];
    iVar2 = (surface->m_size).m_data[1];
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      iVar5 = distSquaredToNeighbor<4>::s_coords[lVar9][0] + x;
      if ((((-1 < iVar5) && (iVar5 < iVar1)) &&
          (iVar7 = distSquaredToNeighbor<4>::s_coords[lVar9][1] + y, -1 < iVar7)) && (iVar7 < iVar2)
         ) {
        dVar6 = colorDistSquared(pixel,*(deUint32 *)
                                        ((long)pvVar3 + (long)(iVar5 * 4) + (long)(iVar7 * iVar8)));
        if (dVar6 <= uVar4) {
          uVar4 = dVar6;
        }
        if (uVar4 == 0) {
          return 0;
        }
      }
    }
    iVar8 = 0x21;
    do {
      iVar8 = iVar8 + -1;
      if (iVar8 == 0) {
        return uVar4;
      }
      fVar10 = deRandom_getFloat(&rnd->m_rnd);
      fVar11 = deRandom_getFloat(&rnd->m_rnd);
      dVar6 = bilinearSample<4>(surface,fVar10 + fVar10 + (float)x + -0.5,
                                fVar11 + fVar11 + (float)y + -0.5);
      dVar6 = colorDistSquared(pixel,dVar6);
      if (dVar6 <= uVar4) {
        uVar4 = dVar6;
      }
    } while (uVar4 != 0);
  }
  return 0;
}

Assistant:

static deUint32 distSquaredToNeighbor (de::Random& rnd, deUint32 pixel, const ConstPixelBufferAccess& surface, int x, int y)
{
	// (x, y) + (0, 0)
	deUint32	minDist		= colorDistSquared(pixel, readUnorm8<NumChannels>(surface, x, y));

	if (minDist == 0)
		return minDist;

	// Area around (x, y)
	static const int s_coords[][2] =
	{
		{-1, -1},
		{ 0, -1},
		{+1, -1},
		{-1,  0},
		{+1,  0},
		{-1, +1},
		{ 0, +1},
		{+1, +1}
	};

	for (int d = 0; d < (int)DE_LENGTH_OF_ARRAY(s_coords); d++)
	{
		int dx = x + s_coords[d][0];
		int dy = y + s_coords[d][1];

		if (!deInBounds32(dx, 0, surface.getWidth()) || !deInBounds32(dy, 0, surface.getHeight()))
			continue;

		minDist = de::min(minDist, colorDistSquared(pixel, readUnorm8<NumChannels>(surface, dx, dy)));
		if (minDist == 0)
			return minDist;
	}

	// Random bilinear-interpolated samples around (x, y)
	for (int s = 0; s < 32; s++)
	{
		float dx = (float)x + rnd.getFloat()*2.0f - 0.5f;
		float dy = (float)y + rnd.getFloat()*2.0f - 0.5f;

		deUint32 sample = bilinearSample<NumChannels>(surface, dx, dy);

		minDist = de::min(minDist, colorDistSquared(pixel, sample));
		if (minDist == 0)
			return minDist;
	}

	return minDist;
}